

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

time_double
time_function<int,int>(random_numerators<int> *vals,int denom,pFuncToTime<int,_int> timeFunc)

{
  time_double tVar1;
  uint64_t uVar2;
  code *in_RDX;
  undefined8 in_RDI;
  timer t;
  time_double tresult;
  timer local_48;
  code *local_28;
  undefined1 local_1c [4];
  undefined8 local_18;
  uint64_t local_8;
  
  local_28 = in_RDX;
  local_18 = in_RDI;
  timer::timer(&local_48);
  timer::start((timer *)0x10264b);
  local_8 = (*local_28)(local_18,local_1c);
  timer::stop((timer *)0x10266b);
  uVar2 = timer::duration_nano(&local_48);
  tVar1.result = local_8;
  tVar1.time = uVar2;
  return tVar1;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}